

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseVersionInfo(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  xmlParserErrors code;
  
  pxVar2 = ctxt->input;
  pxVar3 = pxVar2->cur;
  if ((((*pxVar3 != 'v') || (pxVar3[1] != 'e')) || (pxVar3[2] != 'r')) ||
     (((pxVar3[3] != 's' || (pxVar3[4] != 'i')) || ((pxVar3[5] != 'o' || (pxVar3[6] != 'n')))))) {
    return (xmlChar *)0x0;
  }
  pxVar2->cur = pxVar3 + 7;
  pxVar2->col = pxVar2->col + 7;
  if (pxVar3[7] == '\0') {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur == '=') {
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    xVar1 = *ctxt->input->cur;
    if (xVar1 == '\'') {
      xmlNextChar(ctxt);
      pxVar3 = xmlParseVersionNum(ctxt);
      if (*ctxt->input->cur != '\'') {
LAB_0013aa0a:
        code = XML_ERR_STRING_NOT_CLOSED;
        goto LAB_0013aa1f;
      }
    }
    else {
      if (xVar1 != '\"') {
        pxVar3 = (xmlChar *)0x0;
        code = XML_ERR_STRING_NOT_STARTED;
        goto LAB_0013aa1f;
      }
      xmlNextChar(ctxt);
      pxVar3 = xmlParseVersionNum(ctxt);
      if (*ctxt->input->cur != '\"') goto LAB_0013aa0a;
    }
    xmlNextChar(ctxt);
  }
  else {
    pxVar3 = (xmlChar *)0x0;
    code = XML_ERR_EQUAL_REQUIRED;
LAB_0013aa1f:
    xmlFatalErr(ctxt,code,(char *)0x0);
  }
  return pxVar3;
}

Assistant:

xmlChar *
xmlParseVersionInfo(xmlParserCtxtPtr ctxt) {
    xmlChar *version = NULL;

    if (CMP7(CUR_PTR, 'v', 'e', 'r', 's', 'i', 'o', 'n')) {
	SKIP(7);
	SKIP_BLANKS;
	if (RAW != '=') {
	    xmlFatalErr(ctxt, XML_ERR_EQUAL_REQUIRED, NULL);
	    return(NULL);
        }
	NEXT;
	SKIP_BLANKS;
	if (RAW == '"') {
	    NEXT;
	    version = xmlParseVersionNum(ctxt);
	    if (RAW != '"') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else if (RAW == '\''){
	    NEXT;
	    version = xmlParseVersionNum(ctxt);
	    if (RAW != '\'') {
		xmlFatalErr(ctxt, XML_ERR_STRING_NOT_CLOSED, NULL);
	    } else
	        NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_STRING_NOT_STARTED, NULL);
	}
    }
    return(version);
}